

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O2

bool __thiscall
cmStateDirectory::ContainsBoth(cmStateDirectory *this,string *param_1,string *remote_path)

{
  bool bVar1;
  bool bVar2;
  PointerType pBVar3;
  string *b;
  string *b_00;
  string *b_01;
  string *b_02;
  
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  bVar1 = ContainsBoth::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)param_1,&pBVar3->RelativePathTopBinary,b);
  if (bVar1) {
    pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    bVar1 = ContainsBoth::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)remote_path,&pBVar3->RelativePathTopBinary,b_00);
  }
  else {
    bVar1 = false;
  }
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  bVar2 = ContainsBoth::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)param_1,&pBVar3->RelativePathTopSource,b_01);
  if (bVar2) {
    pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    bVar2 = ContainsBoth::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)remote_path,&pBVar3->RelativePathTopSource,b_02);
  }
  else {
    bVar2 = false;
  }
  return (bool)(bVar1 | bVar2);
}

Assistant:

bool cmStateDirectory::ContainsBoth(std::string const& local_path,
                                    std::string const& remote_path) const
{
  auto PathEqOrSubDir = [](std::string const& a, std::string const& b) {
    return (cmSystemTools::ComparePath(a, b) ||
            cmSystemTools::IsSubDirectory(a, b));
  };

  bool bothInBinary = PathEqOrSubDir(local_path, GetRelativePathTopBinary()) &&
    PathEqOrSubDir(remote_path, GetRelativePathTopBinary());

  bool bothInSource = PathEqOrSubDir(local_path, GetRelativePathTopSource()) &&
    PathEqOrSubDir(remote_path, GetRelativePathTopSource());

  return bothInBinary || bothInSource;
}